

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::CreateCustomTargetsAndCommands
          (cmLocalGenerator *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lang)

{
  _Rb_tree_header *p_Var1;
  cmGeneratorTarget *this_00;
  cmTarget *this_01;
  size_type sVar2;
  uint uVar3;
  const_iterator cVar4;
  _Base_ptr p_Var5;
  char *__end;
  _Self __tmp;
  string llang;
  cmGeneratorTargetsType tgts;
  string local_b0;
  string local_90;
  cmLocalGenerator *local_70;
  _Base_ptr local_68;
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  local_60;
  
  local_70 = this;
  std::
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::_Rb_tree(&local_60,&(this->Makefile->GeneratorTargets)._M_t);
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    local_68 = &(lang->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      if (*(char *)(*(long *)(p_Var5 + 1) + 0x2e9) == '\0') {
        this_00 = (cmGeneratorTarget *)p_Var5[1]._M_parent;
        uVar3 = cmGeneratorTarget::GetType(this_00);
        if (uVar3 < 4) {
          this_01 = this_00->Target;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"","");
          cmTarget::GetLinkerLanguage(&local_b0,this_01,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          sVar2 = local_b0._M_string_length;
          if (local_b0._M_string_length == 0) {
            cmSystemTools::Error
                      ("CMake can not determine linker language for target: ",
                       (this_00->Target->Name)._M_dataplus._M_p,(char *)0x0,(char *)0x0);
          }
          else {
            cVar4 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find(&lang->_M_t,&local_b0);
            if (cVar4._M_node == local_68) {
              AddBuildTargetRule(local_70,&local_b0,this_00);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if (sVar2 == 0) break;
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  std::
  _Rb_tree<const_cmTarget_*,_std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>,_cmStrictTargetComparison,_std::allocator<std::pair<const_cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void cmLocalGenerator
::CreateCustomTargetsAndCommands(std::set<std::string> const& lang)
{
  cmGeneratorTargetsType tgts = this->Makefile->GetGeneratorTargets();
  for(cmGeneratorTargetsType::iterator l = tgts.begin();
      l != tgts.end(); l++)
    {
    if (l->first->IsImported())
      {
      continue;
      }
    cmGeneratorTarget& target = *l->second;
    switch(target.GetType())
      {
      case cmTarget::STATIC_LIBRARY:
      case cmTarget::SHARED_LIBRARY:
      case cmTarget::MODULE_LIBRARY:
      case cmTarget::EXECUTABLE:
        {
        std::string llang = target.Target->GetLinkerLanguage();
        if(llang.empty())
          {
          cmSystemTools::Error
            ("CMake can not determine linker language for target: ",
             target.Target->GetName().c_str());
          return;
          }
        // if the language is not in the set lang then create custom
        // commands to build the target
        if(lang.count(llang) == 0)
          {
          this->AddBuildTargetRule(llang, target);
          }
        }
        break;
      default:
        break;
      }
    }
}